

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O2

void __thiscall HeavyLight_Queries_Test::TestBody(HeavyLight_Queries_Test *this)

{
  srand(1);
  reset(10);
  generateTree(10);
  initHLD(0,10);
  return;
}

Assistant:

TEST(HeavyLight, Queries) {
    srand(1);
    int n = 10;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        rep(a, 0, n) rep(b, a, n) {
            query(a, b);
        }
        break;
    }
}